

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O0

void __thiscall Sector::remove_gapdata(Sector *this,bool keep_crc)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  Data *data;
  iterator __end1;
  iterator __begin1;
  vector<Data,_std::allocator<Data>_> *__range1;
  bool keep_crc_local;
  Sector *this_local;
  
  bVar1 = has_gapdata(this);
  if (bVar1) {
    __end1 = std::vector<Data,_std::allocator<Data>_>::begin(&this->m_data);
    data = (Data *)std::vector<Data,_std::allocator<Data>_>::end(&this->m_data);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>
                                       *)&data), bVar1) {
      this_00 = &__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>::
                 operator*(&__end1)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      if ((keep_crc) && (bVar1 = has_baddatacrc(this), bVar1)) {
        iVar3 = Data::size((Data *)this_00);
        iVar2 = size(this);
        if (iVar3 < iVar2 + 2) goto LAB_0022d6bb;
        iVar3 = size(this);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (this_00,(long)(iVar3 + 2));
      }
      else {
LAB_0022d6bb:
        iVar3 = size(this);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,(long)iVar3);
      }
      __gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>::operator++
                (&__end1);
    }
  }
  return;
}

Assistant:

void Sector::remove_gapdata(bool keep_crc/*=false*/)
{
    if (!has_gapdata())
        return;

    for (auto& data : m_data)
    {
        // If requested, attempt to preserve CRC bytes on bad sectors.
        if (keep_crc && has_baddatacrc() && data.size() >= (size() + 2))
            data.resize(size() + 2);
        else
            data.resize(size());
    }
}